

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.c
# Opt level: O0

int cfg_append_printable_line(autobuf *autobuf,char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  bool bVar1;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_138 [16];
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined1 local_88 [8];
  va_list ap;
  size_t sStack_60;
  int rv;
  size_t len;
  uchar *_value;
  char *fmt_local;
  autobuf *autobuf_local;
  undefined1 local_11;
  autobuf *local_10;
  
  if (in_AL != '\0') {
    local_108 = in_XMM0_Qa;
    local_f8 = in_XMM1_Qa;
    local_e8 = in_XMM2_Qa;
    local_d8 = in_XMM3_Qa;
    local_c8 = in_XMM4_Qa;
    local_b8 = in_XMM5_Qa;
    local_a8 = in_XMM6_Qa;
    local_98 = in_XMM7_Qa;
  }
  if (autobuf == (autobuf *)0x0) {
    autobuf_local._4_4_ = 0;
  }
  else {
    len = (size_t)(autobuf->_buf + autobuf->_len);
    sStack_60 = autobuf->_len;
    ap[0].overflow_arg_area = local_138;
    ap[0]._0_8_ = &stack0x00000008;
    local_88._4_4_ = 0x30;
    local_88._0_4_ = 0x10;
    local_128 = in_RDX;
    local_120 = in_RCX;
    local_118 = in_R8;
    local_110 = in_R9;
    autobuf_local._4_4_ = abuf_vappendf(autobuf,fmt,(__va_list_tag *)local_88);
    if (-1 < autobuf_local._4_4_) {
      while( true ) {
        bVar1 = false;
        if (*(char *)len != '\0') {
          bVar1 = sStack_60 < autobuf->_len;
          sStack_60 = sStack_60 + 1;
        }
        if (!bVar1) break;
        if (((*(byte *)len < 0x20) || (*(char *)len == '\x7f')) || (*(char *)len == -1)) {
          *(undefined1 *)len = 0x2e;
        }
        len = len + 1;
      }
      local_11 = 10;
      local_10 = autobuf;
      abuf_memcpy(autobuf,&local_11,1);
      autobuf_local._4_4_ = 0;
    }
  }
  return autobuf_local._4_4_;
}

Assistant:

int
cfg_append_printable_line(struct autobuf *autobuf, const char *fmt, ...) {
  unsigned char *_value;
  size_t len;
  int rv;
  va_list ap;

  if (autobuf == NULL)
    return 0;

  _value = (unsigned char *)abuf_getptr(autobuf) + abuf_getlen(autobuf);
  len = abuf_getlen(autobuf);

  va_start(ap, fmt);
  rv = abuf_vappendf(autobuf, fmt, ap);
  va_end(ap);

  if (rv < 0) {
    return rv;
  }

  /* convert everything non-printable to '.' */
  while (*_value && len++ < abuf_getlen(autobuf)) {
    if (*_value < 32 || *_value == 127 || *_value == 255) {
      *_value = '.';
    }
    _value++;
  }
  abuf_append_uint8(autobuf, '\n');
  return 0;
}